

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

GLuint deqp::gls::LifetimeTests::details::getAttachment(Attacher *attacher,GLuint container)

{
  GLuint GVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  char *pcVar4;
  
  GVar1 = (*attacher->_vptr_Attacher[3])(attacher,CONCAT44(in_register_00000034,container));
  local_1a8 = (undefined1  [8])((attacher->super_ContextWrapper).m_ctx.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"// Result of query for ",0x17);
  iVar2 = (*attacher->m_elementType->_vptr_Type[7])();
  pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
  iVar2 = (int)(ostringstream *)&local_1a0;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)local_1a0[-3]);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," attached to ",0xd);
  iVar3 = (*attacher->m_containerType->_vptr_Type[7])();
  pcVar4 = (char *)CONCAT44(extraout_var_00,iVar3);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)local_1a0[-3]);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,": ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return GVar1;
}

Assistant:

GLuint getAttachment (Attacher& attacher, GLuint container)
{
	const GLuint queriedAttachment = attacher.getAttachment(container);
	attacher.log() << TestLog::Message
				   << "// Result of query for " << attacher.getElementType().getName()
				   << " attached to " << attacher.getContainerType().getName() << " "
				   << container << ": " << queriedAttachment << "."
				   << TestLog::EndMessage;
	return queriedAttachment;
}